

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_read(qpdf_data qpdf,char *filename,char *password)

{
  int local_78;
  int local_74;
  _func_void__qpdf_data_ptr *local_50;
  function<void_(_qpdf_data_*)> local_48;
  uint local_24;
  char *pcStack_20;
  QPDF_ERROR_CODE status;
  char *password_local;
  char *filename_local;
  qpdf_data qpdf_local;
  
  local_24 = 0;
  qpdf->filename = filename;
  qpdf->password = password;
  local_50 = call_read;
  pcStack_20 = password;
  password_local = filename;
  filename_local = (char *)qpdf;
  std::function<void(_qpdf_data*)>::function<void(*)(_qpdf_data*),void>
            ((function<void(_qpdf_data*)> *)&local_48,&local_50);
  local_24 = trap_errors(qpdf,&local_48);
  std::function<void_(_qpdf_data_*)>::~function(&local_48);
  if (local_24 == 0) {
    local_74 = 0;
  }
  else {
    if ((local_24 & 1) == 0) {
      local_78 = -1;
      if ((local_24 & 2) != 0) {
        local_78 = 2;
      }
    }
    else {
      local_78 = 1;
    }
    local_74 = local_78;
  }
  QTC::TC("qpdf","qpdf-c called qpdf_read",local_74);
  return local_24;
}

Assistant:

QPDF_ERROR_CODE
qpdf_read(qpdf_data qpdf, char const* filename, char const* password)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = filename;
    qpdf->password = password;
    status = trap_errors(qpdf, &call_read);
    // We no longer have a good way to exercise a file with both warnings and errors because qpdf is
    // getting much better at recovering.
    QTC::TC(
        "qpdf",
        "qpdf-c called qpdf_read",
        (status == 0)                  ? 0
            : (status & QPDF_WARNINGS) ? 1
            : (status & QPDF_ERRORS)   ? 2
                                       : -1);
    return status;
}